

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O2

void xLearn::PrecMetric::prec_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,index_t *true_pos,index_t *false_pos,size_t start_idx,size_t end_idx)

{
  float fVar1;
  float fVar2;
  index_t *piVar3;
  ostream *poVar4;
  size_t i;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (start_idx <= end_idx) {
    *true_pos = 0;
    *false_pos = 0;
    for (; end_idx != start_idx; start_idx = start_idx + 1) {
      fVar1 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[start_idx];
      fVar2 = (Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
              ._M_start[start_idx];
      if (((0.0 < fVar1) && (piVar3 = true_pos, 0.0 < fVar2)) ||
         ((0.0 < fVar1 && (piVar3 = false_pos, fVar2 <= 0.0)))) {
        *piVar3 = *piVar3 + 1;
      }
    }
    return;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"prec_accum_thread",&local_56);
  poVar4 = Logger::Start(ERR,&local_30,0xcb,&local_50);
  poVar4 = std::operator<<(poVar4,"CHECK_GE failed ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xcb);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"end_idx");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"start_idx");
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

static void prec_accum_thread(const std::vector<real_t>* Y,
                                const std::vector<real_t>* pred,
                                index_t* true_pos,
                                index_t* false_pos,
                                size_t start_idx,
                                size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *true_pos = 0;
    *false_pos = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t p_label = (*pred)[i] > 0 ? 1 : -1;
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      if (p_label > 0 && r_label > 0) {
        (*true_pos)++;
      } else if (p_label > 0 && r_label < 0) {
        (*false_pos)++;
      }
    }
  }